

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3_stmt *pz;
  sqlite3 *db;
  undefined8 *puVar1;
  sqlite3 *psVar2;
  undefined8 *puVar3;
  Vdbe *pVVar4;
  Vdbe *pVVar5;
  Vdbe *pVVar6;
  Vdbe *pFromStmt;
  ushort uVar7;
  int rc;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uchar *z;
  char *pcVar12;
  long *plVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  long lVar17;
  char *pcVar18;
  int i;
  long lVar19;
  Mem *pMem;
  int iVar20;
  int iVar21;
  char *pcVar22;
  ulong uVar23;
  byte *pbVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long *plVar28;
  long lVar29;
  Vdbe *p;
  Mem *local_190;
  ulong local_188;
  Vdbe *local_150;
  sqlite3_stmt *local_148;
  long local_140 [34];
  
  iVar8 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar8 != 0) {
    sqlite3MisuseError(0xf8b5);
    return 0x15;
  }
  db = *(sqlite3 **)pStmt;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  uVar7 = *(ushort *)(pStmt + 0x9a) & 0xfbff;
  local_148 = pStmt + 0xb8;
  pz = pStmt + 0x58;
  iVar8 = 0;
  do {
    uVar11 = 7;
    *(ushort *)(pStmt + 0x9a) = uVar7;
    if (*(int *)(pStmt + 0x50) != -0x420df25d) {
      sqlite3_reset(pStmt);
    }
    puVar1 = *(undefined8 **)pStmt;
    if (*(char *)(puVar1 + 10) != '\0') goto LAB_0011bbda;
    uVar7 = *(ushort *)(pStmt + 0x9a);
    if (*(int *)(pStmt + 0x90) < 1) {
      uVar16 = 0x11;
      uVar11 = 1;
      if ((uVar7 & 0x20) == 0) {
        if (*(int *)(pStmt + 0x90) < 0) {
          iVar10 = *(int *)((long)puVar1 + 0x9c);
          if (iVar10 == 0) {
            *(undefined4 *)(puVar1 + 0x29) = 0;
          }
          if ((puVar1[0x19] != 0) && (*(char *)((long)puVar1 + 0x99) == '\0')) {
            sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar1,(sqlite3_int64 *)local_148);
            iVar10 = *(int *)((long)puVar1 + 0x9c);
          }
          *(int *)((long)puVar1 + 0x9c) = iVar10 + 1;
          uVar7 = *(ushort *)(pStmt + 0x9a);
          if ((uVar7 >> 8 & 1) == 0) {
            *(int *)(puVar1 + 0x14) = *(int *)(puVar1 + 0x14) + 1;
            uVar7 = *(ushort *)(pStmt + 0x9a);
          }
          *(undefined4 *)(pStmt + 0x90) = 0;
        }
        goto LAB_0011b1c9;
      }
      goto LAB_0011b4a0;
    }
LAB_0011b1c9:
    if ((uVar7 & 3) == 0) {
      *(int *)((long)puVar1 + 0xa4) = *(int *)((long)puVar1 + 0xa4) + 1;
      uVar9 = sqlite3VdbeExec((Vdbe *)pStmt);
      *(int *)((long)puVar1 + 0xa4) = *(int *)((long)puVar1 + 0xa4) + -1;
      uVar11 = 100;
      if (uVar9 != 100) goto LAB_0011b3a0;
      goto LAB_0011b481;
    }
    psVar2 = *(sqlite3 **)pStmt;
    lVar29 = *(long *)(pStmt + 0x10);
    local_190 = (Mem *)(lVar29 + 0x38);
    releaseMemArray(local_190,8);
    *(undefined8 *)(pStmt + 0x28) = 0;
    if (*(int *)(pStmt + 0x94) == 7) {
      psVar2->mallocFailed = '\x01';
      uVar9 = 1;
      goto LAB_0011b3a0;
    }
    iVar10 = *(int *)(pStmt + 0x34);
    uVar7 = *(ushort *)(pStmt + 0x9a) & 3;
    iVar21 = iVar10;
    if (uVar7 == 1) {
      lVar19 = *(long *)(pStmt + 0x10);
      if ((*(byte *)(lVar19 + 0x21c) & 0x10) == 0) {
        plVar28 = (long *)0x0;
        local_188 = 0;
      }
      else {
        local_188 = (ulong)(uint)(*(int *)(lVar19 + 0x218) >> 3);
        plVar28 = *(long **)(lVar19 + 0x200);
      }
      pMem = (Mem *)(lVar19 + 0x1f8);
      uVar14 = 0;
      if (0 < (int)local_188) {
        uVar14 = local_188;
      }
      for (uVar23 = 0; uVar14 != uVar23; uVar23 = uVar23 + 1) {
        iVar21 = iVar21 + *(int *)(plVar28[uVar23] + 8);
      }
    }
    else {
      plVar28 = (long *)0x0;
      pMem = (Mem *)0x0;
      local_188 = 0;
    }
    iVar27 = *(int *)(pStmt + 0x90);
    lVar19 = (long)iVar27;
    iVar20 = iVar27;
    if (lVar19 < iVar21) {
      iVar20 = iVar21;
    }
    lVar26 = lVar19 * 0x18;
    lVar25 = lVar19;
    do {
      iVar27 = iVar27 + 1;
      if (iVar21 <= lVar25) {
        *(int *)(pStmt + 0x90) = iVar20 + 1;
        *(undefined4 *)(pStmt + 0x94) = 0;
        uVar9 = 0x65;
        goto LAB_0011b3a0;
      }
      lVar17 = lVar19;
      if (uVar7 != 2) break;
      pcVar12 = (char *)(*(long *)(pStmt + 8) + lVar26);
      lVar26 = lVar26 + 0x18;
      lVar17 = lVar25;
      lVar25 = lVar25 + 1;
    } while (*pcVar12 != -0x6a);
    iVar21 = (int)lVar17;
    *(int *)(pStmt + 0x90) = iVar27;
    if ((psVar2->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x94) = 9;
      sqlite3SetString((char **)pz,psVar2,"%s");
      uVar9 = 1;
      goto LAB_0011b3a0;
    }
    iVar27 = iVar21 - iVar10;
    plVar13 = plVar28;
    if (iVar21 < iVar10) {
      pbVar24 = (byte *)((long)iVar21 * 0x18 + *(long *)(pStmt + 8));
      iVar27 = iVar21;
    }
    else {
      while( true ) {
        iVar10 = (int)((long *)*plVar13)[1];
        if (iVar27 < iVar10) break;
        plVar13 = plVar13 + 1;
        iVar27 = iVar27 - iVar10;
      }
      pbVar24 = (byte *)((long)iVar27 * 0x18 + *(long *)*plVar13);
    }
    if (uVar7 == 1) {
      *(undefined2 *)(lVar29 + 0x5c) = 4;
      *(undefined1 *)(lVar29 + 0x5e) = 1;
      *(long *)(lVar29 + 0x50) = (long)iVar27;
      *(undefined2 *)(lVar29 + 0x94) = 0xa02;
      pcVar12 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar24 * 8);
      *(char **)(lVar29 + 0x78) = pcVar12;
      iVar10 = sqlite3Strlen30(pcVar12);
      *(int *)(lVar29 + 0x90) = iVar10;
      *(undefined2 *)(lVar29 + 0x96) = 0x103;
      local_190 = (Mem *)(lVar29 + 0xa8);
      if (pbVar24[1] == 0xee) {
        iVar10 = (int)local_188;
        iVar21 = iVar10 * 8 + 8;
        uVar14 = 0;
        if (0 < iVar10) {
          uVar14 = local_188;
        }
        for (uVar23 = 0; uVar14 != uVar23; uVar23 = uVar23 + 1) {
          if (plVar28[uVar23] == *(long *)(pbVar24 + 0x10)) {
            uVar14 = uVar23 & 0xffffffff;
            break;
          }
        }
        if (((int)uVar14 == iVar10) &&
           (iVar27 = sqlite3VdbeMemGrow(pMem,iVar21,(uint)(iVar10 != 0)), iVar27 == 0)) {
          *(undefined8 *)(pMem->z + (long)iVar10 * 8) = *(undefined8 *)(pbVar24 + 0x10);
          *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
          pMem->n = iVar21;
        }
      }
    }
    local_190->flags = 4;
    local_190->u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar24 + 4);
    local_190->type = '\x01';
    local_190[1].flags = 4;
    local_190[1].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar24 + 8);
    local_190[1].type = '\x01';
    local_190[2].flags = 4;
    local_190[2].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(pbVar24 + 0xc);
    local_190[2].type = '\x01';
    iVar10 = sqlite3VdbeMemGrow(local_190 + 3,0x20,0);
    uVar9 = 1;
    if (iVar10 != 0) goto LAB_0011b3a0;
    local_190[3].flags = 0x602;
    pcVar12 = local_190[3].z;
    pcVar22 = pcVar12;
    switch(pbVar24[1]) {
    case 0xed:
      *pcVar12 = '\0';
      break;
    case 0xee:
      pcVar18 = "program";
      goto LAB_0011b979;
    case 0xef:
    case 0xfa:
      lVar29 = *(long *)(pbVar24 + 0x10);
      sqlite3_snprintf(0x20,pcVar12,"keyinfo(%d");
      uVar11 = sqlite3Strlen30(pcVar12);
      for (uVar14 = 0; uVar23 = (ulong)uVar11, uVar14 < *(ushort *)(lVar29 + 10);
          uVar14 = uVar14 + 1) {
        puVar3 = *(undefined8 **)(lVar29 + 0x18 + uVar14 * 8);
        pcVar18 = "nil";
        if (puVar3 != (undefined8 *)0x0) {
          pcVar18 = (char *)*puVar3;
        }
        iVar10 = sqlite3Strlen30(pcVar18);
        if (0x1a < (int)(uVar11 + iVar10)) {
          builtin_strncpy(pcVar12 + uVar23,",...",4);
          break;
        }
        pcVar12[uVar23] = ',';
        if (*(char *)(*(long *)(lVar29 + 0x10) + uVar14) == '\0') {
          uVar11 = (uint)(uVar23 + 1);
        }
        else {
          uVar11 = uVar11 + 2;
          pcVar12[uVar23 + 1] = '-';
        }
        memcpy(pcVar12 + uVar11,pcVar18,(ulong)(iVar10 + 1));
        uVar11 = uVar11 + iVar10;
      }
      (pcVar12 + uVar23)[0] = ')';
      (pcVar12 + uVar23)[1] = '\0';
      break;
    default:
      pcVar22 = *(char **)(pbVar24 + 0x10);
      if (*(char **)(pbVar24 + 0x10) == (char *)0x0) {
        *pcVar12 = '\0';
        pcVar22 = pcVar12;
      }
      break;
    case 0xf1:
      pcVar18 = "intarray";
LAB_0011b979:
      sqlite3_snprintf(0x20,pcVar12,pcVar18);
      break;
    case 0xf2:
      sqlite3_snprintf(0x20,pcVar12,"%d",(ulong)*(uint *)(pbVar24 + 0x10));
      break;
    case 0xf3:
      uVar15 = **(undefined8 **)(pbVar24 + 0x10);
      pcVar18 = "%lld";
      goto LAB_0011b92a;
    case 0xf4:
      sqlite3_snprintf(0x20,pcVar12,"%.16g",(int)**(undefined8 **)(pbVar24 + 0x10));
      break;
    case 0xf6:
      sqlite3_snprintf(0x20,pcVar12,"vtab:%p:%p");
      break;
    case 0xf8:
      lVar29 = *(long *)(pbVar24 + 0x10);
      uVar7 = *(ushort *)(lVar29 + 0x24);
      if ((uVar7 & 2) == 0) {
        if ((uVar7 & 4) == 0) {
          if ((uVar7 & 8) == 0) {
            pcVar22 = "(blob)";
            if ((uVar7 & 1) != 0) {
              sqlite3_snprintf(0x20,pcVar12,"NULL");
              pcVar22 = pcVar12;
            }
          }
          else {
            sqlite3_snprintf(0x20,pcVar12,"%.16g",(int)*(undefined8 *)(lVar29 + 0x10));
          }
        }
        else {
          sqlite3_snprintf(0x20,pcVar12,"%lld",*(undefined8 *)(lVar29 + 0x18));
        }
      }
      else {
        pcVar22 = *(char **)(lVar29 + 8);
      }
      break;
    case 0xfb:
      sqlite3_snprintf(0x20,pcVar12,"%s(%d)",*(undefined8 *)(*(long *)(pbVar24 + 0x10) + 0x30));
      break;
    case 0xfc:
      uVar15 = **(undefined8 **)(pbVar24 + 0x10);
      pcVar18 = "collseq(%.20s)";
LAB_0011b92a:
      sqlite3_snprintf(0x20,pcVar12,pcVar18,uVar15);
    }
    if (pcVar22 == local_190[3].z) {
      iVar10 = sqlite3Strlen30(local_190[3].z);
      local_190[3].n = iVar10;
      local_190[3].enc = '\x01';
    }
    else {
      sqlite3VdbeMemSetStr(local_190 + 3,pcVar22,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    local_190[3].type = '\x03';
    uVar7 = *(ushort *)(pStmt + 0x9a);
    if ((uVar7 & 3) == 1) {
      iVar10 = sqlite3VdbeMemGrow(local_190 + 4,4,0);
      uVar9 = 1;
      if (iVar10 == 0) {
        local_190[4].flags = 0x602;
        local_190[4].n = 2;
        sqlite3_snprintf(3,local_190[4].z,"%.2x");
        local_190[4].type = '\x03';
        local_190[4].enc = '\x01';
        local_190[5].flags = 1;
        local_190[5].type = '\x05';
        uVar7 = *(ushort *)(pStmt + 0x9a);
        goto LAB_0011babb;
      }
LAB_0011b3a0:
      if (((puVar1[0x19] != 0) && (*(char *)((long)puVar1 + 0x99) == '\0')) &&
         (*(long *)(pStmt + 0xd0) != 0)) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar1,local_140);
        (*(code *)puVar1[0x19])
                  (puVar1[0x1a],*(undefined8 *)(pStmt + 0xd0),
                   (local_140[0] - *(long *)(pStmt + 0xb8)) * 1000000);
      }
      uVar11 = uVar9;
      if (uVar9 == 0x65) {
        lVar29 = 8;
        iVar10 = 0;
        for (lVar19 = 0; lVar19 < *(int *)(puVar1 + 5); lVar19 = lVar19 + 1) {
          lVar26 = puVar1[4];
          lVar25 = *(long *)(lVar26 + lVar29);
          if (lVar25 != 0) {
            lVar25 = *(long *)(**(long **)(lVar25 + 8) + 0x118);
            if (lVar25 == 0) {
              iVar21 = 0;
            }
            else {
              iVar21 = *(int *)(lVar25 + 0x18);
              *(undefined4 *)(lVar25 + 0x18) = 0;
            }
            if ((((code *)puVar1[0x21] != (code *)0x0) && (0 < iVar21)) && (iVar10 == 0)) {
              iVar10 = (*(code *)puVar1[0x21])
                                 (puVar1[0x22],puVar1,*(undefined8 *)(lVar26 + -8 + lVar29));
            }
          }
          lVar29 = lVar29 + 0x20;
        }
        *(int *)(pStmt + 0x94) = iVar10;
        uVar11 = 1;
        if (iVar10 == 0) {
          uVar11 = 0x65;
        }
      }
    }
    else {
LAB_0011babb:
      *(ushort *)(pStmt + 0x48) = (~uVar7 & 3) << 2;
      *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
      *(undefined4 *)(pStmt + 0x94) = 0;
      uVar11 = 100;
    }
LAB_0011b481:
    uVar16 = 7;
    *(uint *)((long)puVar1 + 0x44) = uVar11;
    iVar10 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x94));
    if (iVar10 == 7) {
LAB_0011b4a0:
      *(undefined4 *)(pStmt + 0x94) = uVar16;
    }
    if ((uVar11 - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x9a) & 0x200) != 0)) {
      uVar11 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    uVar11 = uVar11 & *(uint *)(puVar1 + 9);
    if (uVar11 != 0x11) goto LAB_0011bbe4;
    if (iVar8 == 0x32) {
      uVar11 = 0x11;
      goto LAB_0011bbe4;
    }
    if (((byte)pStmt[0x9b] & 2) == 0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = *(char **)(pStmt + 0xd0);
    }
    psVar2 = *(sqlite3 **)pStmt;
    uVar11 = sqlite3LockAndPrepare
                       (psVar2,pcVar12,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_150,(char **)0x0);
    pFromStmt = local_150;
    if (uVar11 != 0) {
      if (uVar11 == 7) {
        psVar2->mallocFailed = '\x01';
      }
      if ((((byte)pStmt[0x9b] & 2) != 0) && (db->pErr != (sqlite3_value *)0x0)) {
        z = sqlite3_value_text(db->pErr);
        sqlite3DbFree(db,*(char **)pz);
        if (db->mallocFailed == '\0') {
          pcVar12 = sqlite3DbStrDup(db,(char *)z);
        }
        else {
          uVar11 = 7;
          pcVar12 = (char *)0x0;
        }
        *(char **)pz = pcVar12;
LAB_0011bbda:
        *(uint *)(pStmt + 0x94) = uVar11;
      }
LAB_0011bbe4:
      iVar8 = sqlite3ApiExit(db,uVar11);
      if (db->mutex == (sqlite3_mutex *)0x0) {
        return iVar8;
      }
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      return iVar8;
    }
    iVar8 = iVar8 + 1;
    memcpy(local_140,local_150,0x110);
    memcpy(pFromStmt,pStmt,0x110);
    memcpy(pStmt,local_140,0x110);
    pVVar4 = *(Vdbe **)(pStmt + 0x68);
    pVVar5 = pFromStmt->pPrev;
    pVVar6 = pFromStmt->pNext;
    pFromStmt->pPrev = *(Vdbe **)(pStmt + 0x60);
    pFromStmt->pNext = pVVar4;
    *(Vdbe **)(pStmt + 0x60) = pVVar5;
    *(Vdbe **)(pStmt + 0x68) = pVVar6;
    pcVar12 = pFromStmt->zSql;
    pFromStmt->zSql = *(char **)(pStmt + 0xd0);
    *(char **)(pStmt + 0xd0) = pcVar12;
    *(ushort *)(pStmt + 0x9a) =
         *(ushort *)(pStmt + 0x9a) & 0xfdff | *(ushort *)&pFromStmt->field_0x9a & 0x200;
    sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,pStmt);
    local_150->rc = 0;
    sqlite3VdbeFinalize(local_150);
    sqlite3_reset(pStmt);
    uVar7 = *(ushort *)(pStmt + 0x9a) | 0x400;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY
         && (rc2 = rc = sqlite3Reprepare(v))==SQLITE_OK ){
    sqlite3_reset(pStmt);
    v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK && ALWAYS(v->isPrepareV2) && ALWAYS(db->pErr) ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}